

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::Clear(UniDirectionalLSTMLayerParams *this)

{
  LSTMParams *this_00;
  LSTMWeightParams *this_01;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  UniDirectionalLSTMLayerParams *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Clear
            (&this->activations_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->params_ != (LSTMParams *)0x0)) &&
     (this_00 = this->params_, this_00 != (LSTMParams *)0x0)) {
    LSTMParams::~LSTMParams(this_00);
    operator_delete(this_00,0x20);
  }
  this->params_ = (LSTMParams *)0x0;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->weightparams_ != (LSTMWeightParams *)0x0)) &&
     (this_01 = this->weightparams_, this_01 != (LSTMWeightParams *)0x0)) {
    LSTMWeightParams::~LSTMWeightParams(this_01);
    operator_delete(this_01,0x90);
  }
  this->weightparams_ = (LSTMWeightParams *)0x0;
  memset(&this->inputvectorsize_,0,0x11);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && params_ != nullptr) {
    delete params_;
  }
  params_ = nullptr;
  if (GetArenaForAllocation() == nullptr && weightparams_ != nullptr) {
    delete weightparams_;
  }
  weightparams_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}